

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O3

string * fizplex::MPSReader::next_word(string *__return_storage_ptr__,istringstream *iss)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator>>((istream *)iss,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string next_word(std::istringstream &iss) {
  std::string word;
  iss >> word;
  return word;
}